

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KM_util.cpp
# Opt level: O0

Result_t * __thiscall
Kumu::Result_t::operator()(Result_t *__return_storage_ptr__,Result_t *this,int *line,char *filename)

{
  char local_828 [8];
  char buf [2048];
  char *filename_local;
  int *line_local;
  Result_t *this_local;
  Result_t *result;
  
  buf._2040_8_ = filename;
  if (filename == (char *)0x0) {
    __assert_fail("filename",
                  "/workspace/llm4binary/github/license_c_cmakelists/cinecert[P]asdcplib/src/KM_util.cpp"
                  ,0xca,
                  "const Kumu::Result_t Kumu::Result_t::operator()(const int &, const char *) const"
                 );
  }
  snprintf(local_828,0x7ff,"%s, line %d",filename,(ulong)(uint)*line);
  Result_t(__return_storage_ptr__,this);
  std::__cxx11::string::operator=((string *)&__return_storage_ptr__->message,local_828);
  return __return_storage_ptr__;
}

Assistant:

const Kumu::Result_t
Kumu::Result_t::operator()(const int& line, const char* filename) const
{
  assert(filename);
  char buf[MESSAGE_BUF_MAX];
  snprintf(buf, MESSAGE_BUF_MAX-1, "%s, line %d", filename, line);

  Result_t result = *this;
  result.message = buf;
  return result;
}